

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

bool __thiscall
QToolBarAreaLayoutInfo::insertGap(QToolBarAreaLayoutInfo *this,QList<int> *path,QLayoutItem *item)

{
  QToolBarAreaLayoutItem *this_00;
  Orientation OVar1;
  long i;
  QSize QVar2;
  Representation RVar3;
  pointer pQVar4;
  pointer pQVar5;
  QSize QVar6;
  ulong i_00;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  long in_FS_OFFSET;
  QToolBarAreaLayoutLine local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = (long)*(path->d).ptr;
  i = (this->lines).d.size;
  if (i == lVar9) {
    local_68.rect.x1.m_i = 0;
    local_68.rect.y1.m_i = 0;
    local_68.rect.x2.m_i = -1;
    local_68.rect.y2.m_i = -1;
    local_68.o = this->o;
    local_68.toolBarItems.d.d = (Data *)0x0;
    local_68.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
    local_68.toolBarItems.d.size = 0;
    QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine>
              ((QMovableArrayOps<QToolBarAreaLayoutLine> *)this,i,&local_68);
    QList<QToolBarAreaLayoutLine>::end(&this->lines);
    if (&(local_68.toolBarItems.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_68.toolBarItems.d.d)->super_QArrayData,0x18,0x10);
      }
    }
  }
  pQVar4 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
  i_00 = (ulong)(path->d).ptr[1];
  local_68.rect.x2.m_i = 0;
  local_68.rect.y2.m_i = -1;
  local_68.o = 0xffffffff;
  local_68._20_4_ = 0xaaaaaa01;
  local_68.rect._0_8_ = item;
  if (0 < (long)i_00) {
    uVar10 = i_00;
    while( true ) {
      uVar8 = (int)uVar10 - 1;
      pQVar5 = QList<QToolBarAreaLayoutItem>::data(&pQVar4[lVar9].toolBarItems);
      this_00 = pQVar5 + uVar8;
      if (this_00->gap == false) {
        if (this_00->widgetItem == (QLayoutItem *)0x0) {
          cVar11 = '\x01';
        }
        else {
          iVar7 = (*this_00->widgetItem->_vptr_QLayoutItem[8])();
          cVar11 = (char)iVar7;
        }
      }
      else {
        cVar11 = '\0';
      }
      if (cVar11 == '\0') break;
      if ((int)uVar10 < 2) goto LAB_004b86b6;
      uVar10 = (ulong)uVar8;
    }
    OVar1 = pQVar4[lVar9].o;
    QVar6 = QToolBarAreaLayoutItem::sizeHint(this_00);
    QVar2 = (QSize)((ulong)QVar6 >> 0x20);
    if (OVar1 == Horizontal) {
      QVar2 = QVar6;
    }
    RVar3 = QVar2.wd.m_i;
    iVar7 = this_00->size - RVar3.m_i;
    if (iVar7 != 0 && RVar3.m_i <= this_00->size) {
      this_00->preferredSize = -1;
      this_00->size = RVar3.m_i;
      QToolBarAreaLayoutItem::resize((QToolBarAreaLayoutItem *)&local_68,this->o,iVar7);
    }
  }
LAB_004b86b6:
  QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem_const&>
            ((QPodArrayOps<QToolBarAreaLayoutItem> *)&pQVar4[lVar9].toolBarItems,i_00,
             (QToolBarAreaLayoutItem *)&local_68);
  QList<QToolBarAreaLayoutItem>::begin(&pQVar4[lVar9].toolBarItems);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolBarAreaLayoutInfo::insertGap(const QList<int> &path, QLayoutItem *item)
{
    Q_ASSERT(path.size() == 2);
    int j = path.first();
    if (j == lines.size())
        lines.append(QToolBarAreaLayoutLine(o));

    QToolBarAreaLayoutLine &line = lines[j];
    const int k = path.at(1);

    QToolBarAreaLayoutItem gap_item;
    gap_item.gap = true;
    gap_item.widgetItem = item;

    //update the previous item's preferred size
    for(int p = k - 1 ; p >= 0; --p) {
        QToolBarAreaLayoutItem &previous = line.toolBarItems[p];
        if (!previous.skip()) {
            //we found the previous one
            int previousSizeHint = pick(line.o, previous.sizeHint());
            int previousExtraSpace = previous.size - previousSizeHint;

            if (previousExtraSpace > 0) {
                //in this case we reset the space
                previous.preferredSize = -1;
                previous.size = previousSizeHint;

                gap_item.resize(o, previousExtraSpace);
            }

            break;
        }
    }

    line.toolBarItems.insert(k, gap_item);
    return true;

}